

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inifile.cpp
# Opt level: O1

bool __thiscall utils::IniFile::readFile(IniFile *this,string *filename)

{
  pointer pcVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ulong uVar4;
  char cVar5;
  int iVar6;
  istream *piVar7;
  long lVar8;
  ulong uVar9;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar10;
  undefined8 uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  undefined1 *puVar13;
  _Alloc_hider _Var14;
  long lVar15;
  char *pcVar16;
  undefined1 *puVar17;
  char *pcVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  char *pcVar21;
  bool bVar22;
  string name;
  string line;
  string value;
  string group;
  wordexp_t exp_res;
  ifstream file;
  key_type local_440;
  long local_420;
  char *local_418;
  ulong local_410;
  char local_408;
  undefined7 uStack_407;
  undefined8 uStack_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3f8;
  ulong local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3d8;
  ulong local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3b8;
  ulong local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  char *local_398;
  long local_390;
  char local_388 [16];
  char *local_378;
  long local_370;
  char local_368;
  undefined7 uStack_367;
  undefined8 uStack_360;
  undefined1 *local_358 [2];
  undefined1 local_348 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_338;
  ulong local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  undefined1 *local_318;
  long local_310;
  undefined1 local_308 [16];
  undefined1 *local_2f8;
  long local_2f0;
  undefined1 local_2e8 [16];
  undefined1 *local_2d8;
  long local_2d0;
  undefined1 local_2c8 [16];
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_2b8;
  key_type local_2b0;
  char *local_290;
  long local_288;
  char local_280 [16];
  undefined1 *local_270;
  long local_268;
  undefined1 local_260 [16];
  wordexp_t local_250;
  long local_238 [65];
  
  local_2b8 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)this;
  std::ifstream::ifstream(local_238);
  wordexp((filename->_M_dataplus)._M_p,&local_250,0);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)*local_250.we_wordv);
  wordfree(&local_250);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    puVar17 = local_260;
    local_270 = puVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"inifile","");
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_440,local_270,local_270 + local_268);
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
    if (iVar6 != 0) {
LAB_00115133:
      uVar11 = std::__throw_system_error(iVar6);
      if (local_270 != puVar17) {
        operator_delete(local_270);
      }
      std::ifstream::~ifstream(local_238);
      _Unwind_Resume(uVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_440._M_dataplus._M_p,local_440._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"unable to open file",0x13);
    pcVar1 = (filename->_M_dataplus)._M_p;
    local_290 = local_280;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,pcVar1,pcVar1 + filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_290,local_288);
    if (local_290 != local_280) {
      operator_delete(local_290);
    }
    DebugStream::~DebugStream((DebugStream *)&local_398);
    if (local_270 != puVar17) {
      operator_delete(local_270);
    }
    bVar22 = true;
  }
  else {
    local_398 = local_388;
    lVar15 = 0;
    local_390 = 0;
    local_388[0] = '\0';
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    local_2b0._M_string_length = 0;
    local_2b0.field_2._M_local_buf[0] = '\0';
    do {
      cVar5 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_398,cVar5);
      bVar22 = ((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0;
      if (bVar22) break;
      lVar8 = std::__cxx11::string::find((char *)&local_398,0x1176f3,0);
      if (lVar8 != -1) {
        local_420 = lVar15;
        std::__cxx11::string::substr((ulong)&local_3d8,(ulong)&local_398);
        paVar3 = local_3d8;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_3d8->_M_local_buf + local_3d0);
        paVar19 = local_3d8;
        if (0 < (long)local_3d0 >> 2) {
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3d8->_M_local_buf + (local_3d0 & 0xfffffffffffffffc));
          lVar15 = ((long)local_3d0 >> 2) + 1;
          paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3d8->_M_local_buf + 3);
          do {
            iVar6 = isspace((int)paVar12->_M_local_buf[-3]);
            if (iVar6 == 0) {
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar12->_M_local_buf + -3);
              goto LAB_001140e2;
            }
            iVar6 = isspace((int)paVar12->_M_local_buf[-2]);
            if (iVar6 == 0) {
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar12->_M_local_buf + -2);
              goto LAB_001140e2;
            }
            iVar6 = isspace((int)paVar12->_M_local_buf[-1]);
            if (iVar6 == 0) {
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar12->_M_local_buf + -1);
              goto LAB_001140e2;
            }
            iVar6 = isspace((int)paVar12->_M_local_buf[0]);
            if (iVar6 == 0) goto LAB_001140e2;
            lVar15 = lVar15 + -1;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar12->_M_local_buf + 4);
          } while (1 < lVar15);
        }
        lVar15 = (long)paVar20 - (long)paVar19->_M_local_buf;
        if (lVar15 == 1) {
LAB_001140d0:
          iVar6 = isspace((int)paVar19->_M_local_buf[0]);
          paVar12 = paVar19;
          if (iVar6 != 0) {
            paVar12 = paVar20;
          }
        }
        else if (lVar15 == 2) {
LAB_0011409d:
          iVar6 = isspace((int)paVar19->_M_local_buf[0]);
          paVar12 = paVar19;
          if (iVar6 != 0) {
            paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar19->_M_local_buf + 1);
            goto LAB_001140d0;
          }
        }
        else {
          paVar12 = paVar20;
          if ((lVar15 == 3) &&
             (iVar6 = isspace((int)paVar19->_M_local_buf[0]), paVar12 = paVar19, iVar6 != 0)) {
            paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar19->_M_local_buf + 1);
            goto LAB_0011409d;
          }
        }
LAB_001140e2:
        if (paVar20 == paVar12) {
          local_3d0 = 0;
          paVar3->_M_local_buf[0] = '\0';
        }
        else {
          std::__cxx11::string::_M_erase((ulong)&local_3d8,0);
        }
        paVar3 = local_3d8;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_3d8->_M_local_buf + local_3d0);
        paVar19 = paVar20;
        if (0 < (long)local_3d0 >> 2) {
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3d8->_M_local_buf + ((uint)local_3d0 & 3));
          lVar15 = ((long)local_3d0 >> 2) + 1;
          do {
            iVar6 = isspace((int)paVar20->_M_local_buf[-1]);
            if (iVar6 == 0) goto LAB_00114218;
            iVar6 = isspace((int)paVar20->_M_local_buf[-2]);
            if (iVar6 == 0) {
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar20->_M_local_buf + -1);
              goto LAB_00114218;
            }
            iVar6 = isspace((int)paVar20->_M_local_buf[-3]);
            if (iVar6 == 0) {
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar20->_M_local_buf + -2);
              goto LAB_00114218;
            }
            iVar6 = isspace((int)paVar20->_M_local_buf[-4]);
            if (iVar6 == 0) {
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar20->_M_local_buf + -3);
              goto LAB_00114218;
            }
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar20->_M_local_buf + -4);
            lVar15 = lVar15 + -1;
          } while (1 < lVar15);
        }
        lVar15 = (long)paVar19 - (long)paVar3;
        if (lVar15 == 1) {
LAB_001141de:
          iVar6 = isspace((int)paVar19->_M_local_buf[-1]);
          paVar20 = paVar19;
          if (iVar6 != 0) {
            paVar20 = paVar3;
          }
        }
        else {
          paVar20 = paVar19;
          if (lVar15 == 2) {
LAB_001141cd:
            iVar6 = isspace((int)paVar20->_M_local_buf[-1]);
            if (iVar6 != 0) {
              paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar20->_M_local_buf + -1);
              goto LAB_001141de;
            }
          }
          else {
            paVar20 = paVar3;
            if ((lVar15 == 3) &&
               (iVar6 = isspace((int)paVar19->_M_local_buf[-1]), paVar20 = paVar19, iVar6 != 0)) {
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar19->_M_local_buf + -1);
              goto LAB_001141cd;
            }
          }
        }
LAB_00114218:
        lVar15 = local_420;
        local_440._M_string_length = (long)paVar20 - (long)paVar3;
        paVar20->_M_local_buf[0] = '\0';
        if (local_3d8 == &local_3c8) {
          local_440.field_2._8_8_ = local_3c8._8_8_;
          local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        }
        else {
          local_440._M_dataplus._M_p = (pointer)local_3d8;
        }
        local_440.field_2._M_allocated_capacity._1_7_ = local_3c8._M_allocated_capacity._1_7_;
        local_440.field_2._M_local_buf[0] = local_3c8._M_local_buf[0];
        local_3d0 = 0;
        local_3c8._M_local_buf[0] = '\0';
        local_3d8 = &local_3c8;
        std::__cxx11::string::operator=((string *)&local_398,(string *)&local_440);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p);
        }
        if (local_3d8 != &local_3c8) {
          operator_delete(local_3d8);
        }
      }
      paVar20 = &local_440.field_2;
      lVar15 = lVar15 + 1;
      puVar17 = (undefined1 *)0x2;
      if ((local_390 != 0) && (*local_398 != '#')) {
        cVar5 = (char)&local_398;
        if (*local_398 == '[') {
          lVar8 = std::__cxx11::string::find(cVar5,0x5d);
          if (lVar8 == -1) {
            local_2d8 = local_2c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"inifile","");
            local_440._M_dataplus._M_p = (pointer)paVar20;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_440,local_2d8,local_2d8 + local_2d0);
            iVar6 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
            if (iVar6 != 0) goto LAB_0011512c;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,local_440._M_dataplus._M_p,local_440._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_440._M_dataplus._M_p != paVar20) {
              operator_delete(local_440._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"invalid file, unclosed group at line ",0x25);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            DebugStream::~DebugStream((DebugStream *)&local_378);
            puVar17 = local_2c8;
            puVar13 = local_2d8;
LAB_00114706:
            if (puVar13 != puVar17) {
              operator_delete(puVar13);
            }
            puVar17 = (undefined1 *)0x1;
            goto LAB_00114b74;
          }
          local_420 = lVar15;
          std::__cxx11::string::substr((ulong)&local_3b8,(ulong)&local_398);
          paVar3 = local_3b8;
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3b8->_M_local_buf + local_3b0);
          paVar19 = local_3b8;
          if (0 < (long)local_3b0 >> 2) {
            paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_3b8->_M_local_buf + (local_3b0 & 0xfffffffffffffffc));
            lVar15 = ((long)local_3b0 >> 2) + 1;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_3b8->_M_local_buf + 3);
            do {
              iVar6 = isspace((int)paVar12->_M_local_buf[-3]);
              if (iVar6 == 0) {
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar12->_M_local_buf + -3);
                goto LAB_00114842;
              }
              iVar6 = isspace((int)paVar12->_M_local_buf[-2]);
              if (iVar6 == 0) {
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar12->_M_local_buf + -2);
                goto LAB_00114842;
              }
              iVar6 = isspace((int)paVar12->_M_local_buf[-1]);
              if (iVar6 == 0) {
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar12->_M_local_buf + -1);
                goto LAB_00114842;
              }
              iVar6 = isspace((int)paVar12->_M_local_buf[0]);
              if (iVar6 == 0) goto LAB_00114842;
              lVar15 = lVar15 + -1;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar12->_M_local_buf + 4);
            } while (1 < lVar15);
          }
          lVar15 = (long)paVar20 - (long)paVar19->_M_local_buf;
          if (lVar15 == 1) {
LAB_001143dc:
            iVar6 = isspace((int)paVar19->_M_local_buf[0]);
            paVar12 = paVar19;
            if (iVar6 != 0) {
              paVar12 = paVar20;
            }
          }
          else if (lVar15 == 2) {
LAB_001143cb:
            iVar6 = isspace((int)paVar19->_M_local_buf[0]);
            paVar12 = paVar19;
            if (iVar6 != 0) {
              paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar19->_M_local_buf + 1);
              goto LAB_001143dc;
            }
          }
          else {
            paVar12 = paVar20;
            if ((lVar15 == 3) &&
               (iVar6 = isspace((int)paVar19->_M_local_buf[0]), paVar12 = paVar19, iVar6 != 0)) {
              paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar19->_M_local_buf + 1);
              goto LAB_001143cb;
            }
          }
LAB_00114842:
          if (paVar20 == paVar12) {
            local_3b0 = 0;
            paVar3->_M_local_buf[0] = '\0';
          }
          else {
            std::__cxx11::string::_M_erase((ulong)&local_3b8,0);
          }
          paVar3 = local_3b8;
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3b8->_M_local_buf + local_3b0);
          paVar19 = paVar20;
          if (0 < (long)local_3b0 >> 2) {
            paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_3b8->_M_local_buf + ((uint)local_3b0 & 3));
            lVar15 = ((long)local_3b0 >> 2) + 1;
            do {
              iVar6 = isspace((int)paVar20->_M_local_buf[-1]);
              if (iVar6 == 0) goto LAB_00114ab9;
              iVar6 = isspace((int)paVar20->_M_local_buf[-2]);
              if (iVar6 == 0) {
                paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar20->_M_local_buf + -1);
                goto LAB_00114ab9;
              }
              iVar6 = isspace((int)paVar20->_M_local_buf[-3]);
              if (iVar6 == 0) {
                paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar20->_M_local_buf + -2);
                goto LAB_00114ab9;
              }
              iVar6 = isspace((int)paVar20->_M_local_buf[-4]);
              if (iVar6 == 0) {
                paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar20->_M_local_buf + -3);
                goto LAB_00114ab9;
              }
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar20->_M_local_buf + -4);
              lVar15 = lVar15 + -1;
            } while (1 < lVar15);
          }
          lVar15 = (long)paVar19 - (long)paVar3;
          if (lVar15 == 1) {
LAB_00114951:
            iVar6 = isspace((int)paVar19->_M_local_buf[-1]);
            paVar20 = paVar19;
            if (iVar6 != 0) {
              paVar20 = paVar3;
            }
          }
          else {
            paVar20 = paVar19;
            if (lVar15 == 2) {
LAB_0011493c:
              iVar6 = isspace((int)paVar20->_M_local_buf[-1]);
              if (iVar6 != 0) {
                paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar20->_M_local_buf + -1);
                goto LAB_00114951;
              }
            }
            else {
              paVar20 = paVar3;
              if ((lVar15 == 3) &&
                 (iVar6 = isspace((int)paVar19->_M_local_buf[-1]), paVar20 = paVar19, iVar6 != 0)) {
                paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar19->_M_local_buf + -1);
                goto LAB_0011493c;
              }
            }
          }
LAB_00114ab9:
          lVar15 = local_420;
          local_440._M_string_length = (long)paVar20 - (long)paVar3;
          paVar20->_M_local_buf[0] = '\0';
          if (local_3b8 == &local_3a8) {
            local_440.field_2._8_8_ = local_3a8._8_8_;
            local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          }
          else {
            local_440._M_dataplus._M_p = (pointer)local_3b8;
          }
          local_440.field_2._M_allocated_capacity._1_7_ = local_3a8._M_allocated_capacity._1_7_;
          local_440.field_2._M_local_buf[0] = local_3a8._M_local_buf[0];
          local_3b0 = 0;
          local_3a8._M_local_buf[0] = '\0';
          local_3b8 = &local_3a8;
          std::__cxx11::string::operator=((string *)&local_2b0,(string *)&local_440);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p);
          }
          _Var14._M_p = (pointer)local_3b8;
          if (local_3b8 == &local_3a8) goto LAB_00114b74;
        }
        else {
          lVar8 = std::__cxx11::string::find(cVar5,0x3d);
          if (lVar8 == -1) {
            local_2f8 = local_2e8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"inifile","");
            local_440._M_dataplus._M_p = (pointer)paVar20;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_440,local_2f8,local_2f8 + local_2f0);
            iVar6 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
            if (iVar6 == 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_440._M_dataplus._M_p,local_440._M_string_length
                        );
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_440._M_dataplus._M_p != paVar20) {
                operator_delete(local_440._M_dataplus._M_p);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"invalid file, missing = at line ",0x20);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
              std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              DebugStream::~DebugStream((DebugStream *)&local_378);
              puVar17 = local_2e8;
              puVar13 = local_2f8;
              goto LAB_00114706;
            }
            iVar6 = std::__throw_system_error(iVar6);
LAB_0011512c:
            iVar6 = std::__throw_system_error(iVar6);
            goto LAB_00115133;
          }
          std::__cxx11::string::substr((ulong)&local_338,(ulong)&local_398);
          local_358[0] = local_348;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"%20","");
          local_318 = local_308;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_318," ","");
          uVar9 = 0;
          while (uVar9 = std::__cxx11::string::find((char *)&local_338,(ulong)local_358[0],uVar9),
                uVar4 = local_330, uVar9 != 0xffffffffffffffff) {
            std::__cxx11::string::erase((ulong)&local_338,uVar9);
            std::__cxx11::string::replace((ulong)&local_338,uVar9,(char *)0x0,(ulong)local_318);
            uVar9 = uVar9 + local_310;
          }
          if (local_338 == &local_328) {
            local_3e8._8_8_ = local_328._8_8_;
            local_3f8 = &local_3e8;
          }
          else {
            local_3f8 = local_338;
          }
          paVar3 = local_3f8;
          local_3e8._M_allocated_capacity._1_7_ = local_328._M_allocated_capacity._1_7_;
          local_3e8._M_local_buf[0] = local_328._M_local_buf[0];
          local_3f0 = local_330;
          local_330 = 0;
          local_328._M_local_buf[0] = '\0';
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3f8->_M_local_buf + uVar4);
          paVar19 = local_3f8;
          local_420 = lVar15;
          local_338 = &local_328;
          if (0 < (long)uVar4 >> 2) {
            paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_3f8->_M_local_buf + (uVar4 & 0xfffffffffffffffc));
            lVar8 = ((long)uVar4 >> 2) + 1;
            paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_3f8->_M_local_buf + 3);
            do {
              iVar6 = isspace((int)paVar12->_M_local_buf[-3]);
              if (iVar6 == 0) {
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar12->_M_local_buf + -3);
                goto LAB_00114982;
              }
              iVar6 = isspace((int)paVar12->_M_local_buf[-2]);
              if (iVar6 == 0) {
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar12->_M_local_buf + -2);
                goto LAB_00114982;
              }
              iVar6 = isspace((int)paVar12->_M_local_buf[-1]);
              if (iVar6 == 0) {
                paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar12->_M_local_buf + -1);
                goto LAB_00114982;
              }
              iVar6 = isspace((int)paVar12->_M_local_buf[0]);
              if (iVar6 == 0) goto LAB_00114982;
              lVar8 = lVar8 + -1;
              paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar12->_M_local_buf + 4);
            } while (1 < lVar8);
          }
          lVar15 = (long)paVar20 - (long)paVar19->_M_local_buf;
          if (lVar15 == 1) {
LAB_00114809:
            iVar6 = isspace((int)paVar19->_M_local_buf[0]);
            paVar12 = paVar19;
            if (iVar6 != 0) {
              paVar12 = paVar20;
            }
          }
          else if (lVar15 == 2) {
LAB_001147f8:
            iVar6 = isspace((int)paVar19->_M_local_buf[0]);
            paVar12 = paVar19;
            if (iVar6 != 0) {
              paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar19->_M_local_buf + 1);
              goto LAB_00114809;
            }
          }
          else {
            paVar12 = paVar20;
            if ((lVar15 == 3) &&
               (iVar6 = isspace((int)paVar19->_M_local_buf[0]), paVar12 = paVar19, iVar6 != 0)) {
              paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar19->_M_local_buf + 1);
              goto LAB_001147f8;
            }
          }
LAB_00114982:
          if (paVar20 == paVar12) {
            local_3f0 = 0;
            paVar3->_M_local_buf[0] = '\0';
          }
          else {
            std::__cxx11::string::_M_erase((ulong)&local_3f8,0);
          }
          paVar3 = local_3f8;
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_3f8->_M_local_buf + local_3f0);
          paVar19 = paVar20;
          if (0 < (long)local_3f0 >> 2) {
            paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_3f8->_M_local_buf + ((uint)local_3f0 & 3));
            lVar15 = ((long)local_3f0 >> 2) + 1;
            do {
              iVar6 = isspace((int)paVar20->_M_local_buf[-1]);
              if (iVar6 == 0) goto LAB_00114b94;
              iVar6 = isspace((int)paVar20->_M_local_buf[-2]);
              if (iVar6 == 0) {
                paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar20->_M_local_buf + -1);
                goto LAB_00114b94;
              }
              iVar6 = isspace((int)paVar20->_M_local_buf[-3]);
              if (iVar6 == 0) {
                paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar20->_M_local_buf + -2);
                goto LAB_00114b94;
              }
              iVar6 = isspace((int)paVar20->_M_local_buf[-4]);
              if (iVar6 == 0) {
                paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar20->_M_local_buf + -3);
                goto LAB_00114b94;
              }
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar20->_M_local_buf + -4);
              lVar15 = lVar15 + -1;
            } while (1 < lVar15);
          }
          lVar15 = (long)paVar19 - (long)paVar3;
          if (lVar15 == 1) {
LAB_00114a70:
            iVar6 = isspace((int)paVar19->_M_local_buf[-1]);
            paVar20 = paVar19;
            if (iVar6 != 0) {
              paVar20 = paVar3;
            }
          }
          else {
            paVar20 = paVar19;
            if (lVar15 == 2) {
LAB_00114a5f:
              iVar6 = isspace((int)paVar20->_M_local_buf[-1]);
              if (iVar6 != 0) {
                paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar20->_M_local_buf + -1);
                goto LAB_00114a70;
              }
            }
            else {
              paVar20 = paVar3;
              if ((lVar15 == 3) &&
                 (iVar6 = isspace((int)paVar19->_M_local_buf[-1]), paVar20 = paVar19, iVar6 != 0)) {
                paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(paVar19->_M_local_buf + -1);
                goto LAB_00114a5f;
              }
            }
          }
LAB_00114b94:
          local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          local_440._M_string_length = (long)paVar20 - (long)paVar3;
          paVar20->_M_local_buf[0] = '\0';
          if (local_3f8 == &local_3e8) {
            local_440.field_2._8_8_ = local_3e8._8_8_;
          }
          else {
            local_440._M_dataplus._M_p = (pointer)local_3f8;
          }
          local_440.field_2._M_allocated_capacity = local_3e8._M_allocated_capacity;
          local_3f0 = 0;
          local_3e8._M_allocated_capacity = local_3e8._M_allocated_capacity & 0xffffffffffffff00;
          local_3f8 = &local_3e8;
          if (local_318 != local_308) {
            operator_delete(local_318);
          }
          if (local_358[0] != local_348) {
            operator_delete(local_358[0]);
          }
          if (local_338 != &local_328) {
            operator_delete(local_338);
          }
          std::__cxx11::string::substr((ulong)&local_418,(ulong)&local_398);
          pcVar2 = local_418;
          pcVar21 = local_418 + local_410;
          pcVar16 = local_418;
          if (0 < (long)local_410 >> 2) {
            pcVar16 = local_418 + (local_410 & 0xfffffffffffffffc);
            lVar15 = ((long)local_410 >> 2) + 1;
            pcVar18 = local_418 + 3;
            do {
              iVar6 = isspace((int)pcVar18[-3]);
              if (iVar6 == 0) {
                pcVar18 = pcVar18 + -3;
                goto LAB_00114d38;
              }
              iVar6 = isspace((int)pcVar18[-2]);
              if (iVar6 == 0) {
                pcVar18 = pcVar18 + -2;
                goto LAB_00114d38;
              }
              iVar6 = isspace((int)pcVar18[-1]);
              if (iVar6 == 0) {
                pcVar18 = pcVar18 + -1;
                goto LAB_00114d38;
              }
              iVar6 = isspace((int)*pcVar18);
              if (iVar6 == 0) goto LAB_00114d38;
              lVar15 = lVar15 + -1;
              pcVar18 = pcVar18 + 4;
            } while (1 < lVar15);
          }
          lVar15 = (long)pcVar21 - (long)pcVar16;
          if (lVar15 == 1) {
LAB_00114d14:
            iVar6 = isspace((int)*pcVar16);
            pcVar18 = pcVar16;
            if (iVar6 != 0) {
              pcVar18 = pcVar21;
            }
          }
          else if (lVar15 == 2) {
LAB_00114d03:
            iVar6 = isspace((int)*pcVar16);
            pcVar18 = pcVar16;
            if (iVar6 != 0) {
              pcVar16 = pcVar16 + 1;
              goto LAB_00114d14;
            }
          }
          else {
            pcVar18 = pcVar21;
            if ((lVar15 == 3) && (iVar6 = isspace((int)*pcVar16), pcVar18 = pcVar16, iVar6 != 0)) {
              pcVar16 = pcVar16 + 1;
              goto LAB_00114d03;
            }
          }
LAB_00114d38:
          if (pcVar21 == pcVar18) {
            local_410 = 0;
            *pcVar2 = '\0';
          }
          else {
            std::__cxx11::string::_M_erase((ulong)&local_418,0);
          }
          pcVar2 = local_418;
          pcVar21 = local_418 + local_410;
          pcVar16 = pcVar21;
          if (0 < (long)local_410 >> 2) {
            pcVar16 = local_418 + ((uint)local_410 & 3);
            lVar15 = ((long)local_410 >> 2) + 1;
            do {
              iVar6 = isspace((int)pcVar21[-1]);
              if (iVar6 == 0) goto LAB_00114e83;
              iVar6 = isspace((int)pcVar21[-2]);
              if (iVar6 == 0) {
                pcVar21 = pcVar21 + -1;
                goto LAB_00114e83;
              }
              iVar6 = isspace((int)pcVar21[-3]);
              if (iVar6 == 0) {
                pcVar21 = pcVar21 + -2;
                goto LAB_00114e83;
              }
              iVar6 = isspace((int)pcVar21[-4]);
              if (iVar6 == 0) {
                pcVar21 = pcVar21 + -3;
                goto LAB_00114e83;
              }
              pcVar21 = pcVar21 + -4;
              lVar15 = lVar15 + -1;
            } while (1 < lVar15);
          }
          lVar15 = (long)pcVar16 - (long)pcVar2;
          if (lVar15 == 1) {
LAB_00114e31:
            iVar6 = isspace((int)pcVar16[-1]);
            pcVar21 = pcVar16;
            if (iVar6 != 0) {
              pcVar21 = pcVar2;
            }
          }
          else {
            pcVar21 = pcVar16;
            if (lVar15 == 2) {
LAB_00114e20:
              iVar6 = isspace((int)pcVar21[-1]);
              if (iVar6 != 0) {
                pcVar16 = pcVar21 + -1;
                goto LAB_00114e31;
              }
            }
            else {
              pcVar21 = pcVar2;
              if ((lVar15 == 3) &&
                 (iVar6 = isspace((int)pcVar16[-1]), pcVar21 = pcVar16, iVar6 != 0)) {
                pcVar21 = pcVar16 + -1;
                goto LAB_00114e20;
              }
            }
          }
LAB_00114e83:
          lVar15 = local_420;
          *pcVar21 = '\0';
          local_378 = &local_368;
          if (local_418 == &local_408) {
            uStack_360 = uStack_400;
          }
          else {
            local_378 = local_418;
          }
          _local_368 = CONCAT71(uStack_407,local_408);
          local_410 = 0;
          local_408 = '\0';
          local_418 = &local_408;
          local_370 = (long)pcVar21 - (long)pcVar2;
          iVar6 = std::__cxx11::string::compare((char *)&local_440);
          if ((iVar6 != 0) &&
             (iVar6 = std::__cxx11::string::compare((char *)&local_378), iVar6 != 0)) {
            this_00 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       *)std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[](local_2b8,&local_2b0);
            pmVar10 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](this_00,&local_440);
            std::__cxx11::string::_M_assign((string *)pmVar10);
          }
          puVar17 = (undefined1 *)0x0;
          if (local_378 != &local_368) {
            operator_delete(local_378);
          }
          _Var14._M_p = local_440._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p == &local_440.field_2) goto LAB_00114b74;
        }
        puVar17 = (undefined1 *)0x0;
        operator_delete(_Var14._M_p);
      }
LAB_00114b74:
    } while (((ulong)puVar17 & 1) == 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    if (local_398 != local_388) {
      operator_delete(local_398);
    }
  }
  std::ifstream::~ifstream(local_238);
  return bVar22;
}

Assistant:

bool IniFile::readFile(std::string filename)
{
    std::ifstream file;
    wordexp_t exp_res;
    wordexp(filename.c_str(), &exp_res, 0);
    file.open(exp_res.we_wordv[0]);
    wordfree(&exp_res);

    if (!file.is_open()) {
        debug("inifile") << "unable to open file" << filename;
        return 1;
    }

    std::string line;
    std::string group;
    size_t linenum = 0;

    while (std::getline(file, line)) {
        linenum++;
        size_t commentStart = line.find("//");

        if (commentStart != std::string::npos) {
            line = trim(line.substr(0, commentStart));
        }

        if (line.length() == 0 || line.front() == '#') {
            continue;
        }

        if (line[0] == '[') {
            size_t end = line.find(']');

            if (end == std::string::npos) {
                debug("inifile") << "invalid file, unclosed group at line " << linenum;
                return false;
            }

            group = trim(line.substr(1, end - 1));
            continue;
        }

        size_t nameEnd = line.find('=');

        if (nameEnd == std::string::npos) {
            debug("inifile") << "invalid file, missing = at line " << linenum;
            return false;
        }

        std::string name = trim(string_replace(line.substr(0, nameEnd), "%20", " "));
        std::string value = trim(line.substr(nameEnd + 1));

        if (name == "" || value == "") {
            continue;
        }

        m_values[group][name] = value;
    }

    return true;
}